

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall re2::Compiler::ByteRange(Compiler *this,int lo,int hi,bool foldcase)

{
  uint uVar1;
  Frag FVar2;
  
  uVar1 = AllocInst(this,1);
  if ((int)uVar1 < 0) {
    FVar2.begin = 0;
    FVar2.end.p = 0;
  }
  else {
    Prog::Inst::InitByteRange
              ((this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + uVar1,lo,hi,
               (uint)foldcase,0);
    FVar2 = (Frag)((ulong)uVar1 << 0x21 | (ulong)uVar1);
  }
  return FVar2;
}

Assistant:

Frag Compiler::ByteRange(int lo, int hi, bool foldcase) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitByteRange(lo, hi, foldcase, 0);
  return Frag(id, PatchList::Mk(id << 1));
}